

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O3

void do_oldhelp(CHAR_DATA *ch,char *argument)

{
  ushort uVar1;
  short sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  BUFFER *buffer;
  HELP_DATA *pHVar8;
  char argall [4608];
  char argone [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  pcVar6 = "summary";
  if (*argument != '\0') {
    pcVar6 = argument;
  }
  local_2438[0] = '\0';
  if (*pcVar6 != '\0') {
    do {
      pcVar6 = one_argument(pcVar6,local_1238);
      if (local_2438[0] != '\0') {
        sVar7 = strlen(local_2438);
        (local_2438 + sVar7)[0] = ' ';
        (local_2438 + sVar7)[1] = '\0';
      }
      strcat(local_2438,local_1238);
    } while (*pcVar6 != '\0');
  }
  buffer = new_buf();
  if (help_first != (HELP_DATA *)0x0) {
    bVar4 = false;
    pHVar8 = help_first;
    do {
      uVar1 = pHVar8->level;
      iVar5 = get_trust(ch);
      if (((short)((ushort)((uint)(int)(short)uVar1 >> 0xf) ^ uVar1) <= iVar5) ||
         (0x3c < pHVar8->level)) {
        bVar3 = is_name(local_2438,pHVar8->keyword);
        if (bVar3) {
          if (bVar4) {
            add_buf(buffer,
                    "\n\r============================================================\n\r\n\r");
          }
          if (-1 < pHVar8->level) {
            bVar4 = str_cmp(local_2438,"imotd");
            if (bVar4) {
              add_buf(buffer,pHVar8->keyword);
              add_buf(buffer,"\n\r");
            }
          }
          add_buf(buffer,pHVar8->text + (*pHVar8->text == '.'));
          bVar4 = true;
          if (((ch->desc != (DESCRIPTOR_DATA *)0x0) && (sVar2 = ch->desc->connected, sVar2 != 0xd))
             && (sVar2 != 0)) goto LAB_00249bd5;
        }
      }
      pHVar8 = pHVar8->next;
    } while (pHVar8 != (HELP_DATA *)0x0);
    if (bVar4) {
LAB_00249bd5:
      pcVar6 = buf_string(buffer);
      page_to_char(pcVar6,ch);
      goto LAB_00249bf9;
    }
  }
  send_to_char("No help on that word.\n\r",ch);
LAB_00249bf9:
  free_buf(buffer);
  return;
}

Assistant:

void do_oldhelp(CHAR_DATA *ch, char *argument)
{
	bool found= false;
	char argall[MAX_INPUT_LENGTH], argone[MAX_INPUT_LENGTH];

	if (argument[0] == '\0')
		argument = "summary";

	/* this parts handles help a b so that it returns help 'a b' */
	argall[0] = '\0';
	while (argument[0] != '\0')
	{
		argument = one_argument(argument, argone);

		if (argall[0] != '\0')
			strcat(argall, " ");

		strcat(argall, argone);
	}

	auto output = new_buf();
	for (auto pHelp = help_first; pHelp != nullptr; pHelp = pHelp->next)
	{
		auto level = (pHelp->level < 0) ? -1 * pHelp->level - 1 : pHelp->level;

		if (level > get_trust(ch))
		{
			if (pHelp->level < 61)
				continue;
		}

		if (is_name(argall, pHelp->keyword))
		{
			/* add separator if found */
			if (found)
				add_buf(output, "\n\r============================================================\n\r\n\r");

			if (pHelp->level >= 0 && str_cmp(argall, "imotd"))
			{
				add_buf(output, pHelp->keyword);
				add_buf(output, "\n\r");
			}

			/*
			 * Strip leading '.' to allow initial blanks.
			 */
			if (pHelp->text[0] == '.')
				add_buf(output, pHelp->text + 1);
			else
				add_buf(output, pHelp->text);

			found = true;

			/* small hack :) */
			if (ch->desc != nullptr && ch->desc->connected != CON_PLAYING && ch->desc->connected != CON_GEN_GROUPS)
				break;
		}
	}

	if (!found)
		send_to_char("No help on that word.\n\r", ch);
	else
		page_to_char(buf_string(output), ch);

	free_buf(output);
}